

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

void match(int matches,long limit,int num_robots,string *command1,string *command2,string *command3,
          string *command4,bool outputToStdout,bool outputToFullScreen)

{
  long lVar1;
  int iVar2;
  mapped_type *pmVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result_base *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int *piVar7;
  int iVar8;
  _State_baseV2 *__tmp;
  ulong uVar9;
  future<void> *this;
  int n;
  missile *pmVar10;
  long lVar11;
  ulong uVar12;
  _State_baseV2 *__tmp_1;
  robot *prVar13;
  missile (*pamVar14) [2];
  uint *puVar15;
  int iVar16;
  bool bVar17;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  int ties [4];
  int wins [4];
  Forth forth4;
  Forth forth3;
  Forth forth2;
  Forth forth1;
  long local_2110;
  timespec local_2108;
  _func_int **local_20f8 [2];
  __basic_future<void> local_20e8;
  int local_20d4;
  long local_20d0;
  long *local_20c8;
  long *local_20c0;
  long *local_20b8;
  long *local_20b0;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_20a8;
  ulong local_2088;
  int local_207c;
  string *local_2078;
  string *local_2070;
  string *local_2068;
  long local_2060;
  uint local_2058 [4];
  uint local_2048 [6];
  Forth *local_2030 [256];
  Forth *local_1830 [256];
  Forth *local_1030 [256];
  Forth local_830;
  
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  r_debug = 0;
  uVar12 = (ulong)(uint)num_robots;
  local_20d4 = matches;
  local_2078 = command3;
  local_2070 = command2;
  local_2068 = command1;
  if (0 < num_robots) {
    memset(local_2048,0,uVar12 * 4);
    memset(local_2058,0,uVar12 * 4);
  }
  if (num_robots < 2) {
    if (outputToStdout) {
      match();
    }
  }
  else {
    if (0 < local_20d4) {
      local_2060 = uVar12 * 0xb8;
      local_2088 = 1;
      n = num_robots;
      local_20d0 = limit;
      local_207c = num_robots;
      do {
        cppforth::Forth::Forth(&local_830);
        InitForthRobot(&local_830,step);
        local_1030[0] = &local_830;
        pmVar3 = std::
                 map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
                 ::operator[](&Forth2Int,(key_type *)local_1030);
        *pmVar3 = 0;
        cppforth::Forth::Forth((Forth *)local_1030);
        InitForthRobot((Forth *)local_1030,step);
        local_1830[0] = (Forth *)local_1030;
        pmVar3 = std::
                 map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
                 ::operator[](&Forth2Int,(key_type *)local_1830);
        *pmVar3 = 1;
        cppforth::Forth::Forth((Forth *)local_1830);
        InitForthRobot((Forth *)local_1830,step);
        local_2030[0] = (Forth *)local_1830;
        pmVar3 = std::
                 map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
                 ::operator[](&Forth2Int,(key_type *)local_2030);
        *pmVar3 = 2;
        cppforth::Forth::Forth((Forth *)local_2030);
        InitForthRobot((Forth *)local_2030,step);
        local_20a8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_2030;
        pmVar3 = std::
                 map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
                 ::operator[](&Forth2Int,(key_type *)&local_20a8);
        *pmVar3 = 3;
        local_20a8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (future<void> *)0x0;
        local_20a8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (future<void> *)0x0;
        local_20a8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2108.tv_sec = 0;
        local_2108.tv_nsec = 0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157060;
        p_Var6 = p_Var4 + 1;
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001570b0;
        p_Var5 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var5);
        *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(Forth **)&p_Var4[4]._M_use_count = &local_830;
        p_Var4[5]._vptr__Sp_counted_base = (_func_int **)local_2068;
        local_20f8[0] = (_func_int **)0x0;
        local_20c8 = (long *)operator_new(0x20);
        *local_20c8 = (long)&PTR___State_00157108;
        local_20c8[1] = (long)p_Var6;
        local_20c8[2] =
             (long)std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:233:15)>_>,_void>
                   ::_M_run;
        local_20c8[3] = 0;
        std::thread::_M_start_thread(local_20f8,&local_20c8,0);
        if (local_20c8 != (long *)0x0) {
          (**(code **)(*local_20c8 + 8))();
        }
        lVar11 = local_2108.tv_nsec;
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_0010eaf6:
          std::terminate();
        }
        p_Var4[3]._vptr__Sp_counted_base = local_20f8[0];
        bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2108.tv_sec = (__time_t)p_Var6;
        local_2108.tv_nsec = (long)p_Var4;
        if (bVar17) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_sec ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          p_Var6->_M_use_count = 1;
          p_Var6->_M_weak_count = 1;
          p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157148;
          p_Var6[2]._M_use_count = 0;
          p_Var6[1]._M_use_count = 0;
          p_Var6[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var6[1]._M_weak_count + 1) = 0;
          p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157198;
          p_Var5 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)p_Var5 = 0;
          *(undefined8 *)(p_Var5 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(p_Var5);
          lVar11 = local_2108.tv_nsec;
          *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
          p_Var6[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          *(Forth **)&p_Var6[3]._M_use_count = &local_830;
          p_Var6[4]._vptr__Sp_counted_base = (_func_int **)local_2068;
          bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2108.tv_sec = (__time_t)(p_Var6 + 1);
          local_2108.tv_nsec = (long)p_Var6;
          if (bVar17) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
          }
        }
        std::__basic_future<void>::__basic_future(&local_20e8,(__state_type *)&local_2108);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20a8,
                   (future<void> *)&local_20e8);
        if (local_20e8._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_20e8._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_2108.tv_sec = 0;
        local_2108.tv_nsec = 0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001571e0;
        p_Var6 = p_Var4 + 1;
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157230;
        p_Var5 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var5);
        *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(Forth ***)&p_Var4[4]._M_use_count = local_1030;
        p_Var4[5]._vptr__Sp_counted_base = (_func_int **)local_2070;
        local_20f8[0] = (_func_int **)0x0;
        local_20c0 = (long *)operator_new(0x20);
        *local_20c0 = (long)&PTR___State_00157288;
        local_20c0[1] = (long)p_Var6;
        local_20c0[2] =
             (long)std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:245:15)>_>,_void>
                   ::_M_run;
        local_20c0[3] = 0;
        std::thread::_M_start_thread(local_20f8,&local_20c0,0);
        if (local_20c0 != (long *)0x0) {
          (**(code **)(*local_20c0 + 8))();
        }
        lVar11 = local_2108.tv_nsec;
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010eaf6;
        p_Var4[3]._vptr__Sp_counted_base = local_20f8[0];
        bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2108.tv_sec = (__time_t)p_Var6;
        local_2108.tv_nsec = (long)p_Var4;
        if (bVar17) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_sec ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          p_Var6->_M_use_count = 1;
          p_Var6->_M_weak_count = 1;
          p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001572c8;
          p_Var6[2]._M_use_count = 0;
          p_Var6[1]._M_use_count = 0;
          p_Var6[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var6[1]._M_weak_count + 1) = 0;
          p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157318;
          p_Var5 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)p_Var5 = 0;
          *(undefined8 *)(p_Var5 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(p_Var5);
          lVar11 = local_2108.tv_nsec;
          *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
          p_Var6[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          *(Forth ***)&p_Var6[3]._M_use_count = local_1030;
          p_Var6[4]._vptr__Sp_counted_base = (_func_int **)local_2070;
          bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2108.tv_sec = (__time_t)(p_Var6 + 1);
          local_2108.tv_nsec = (long)p_Var6;
          if (bVar17) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
          }
        }
        std::__basic_future<void>::__basic_future(&local_20e8,(__state_type *)&local_2108);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20a8,
                   (future<void> *)&local_20e8);
        if (local_20e8._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_20e8._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_2108.tv_sec = 0;
        local_2108.tv_nsec = 0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157360;
        p_Var6 = p_Var4 + 1;
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001573b0;
        p_Var5 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var5);
        *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(Forth ***)&p_Var4[4]._M_use_count = local_1830;
        p_Var4[5]._vptr__Sp_counted_base = (_func_int **)local_2078;
        local_20f8[0] = (_func_int **)0x0;
        local_20b8 = (long *)operator_new(0x20);
        *local_20b8 = (long)&PTR___State_00157408;
        local_20b8[1] = (long)p_Var6;
        local_20b8[2] =
             (long)std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:257:15)>_>,_void>
                   ::_M_run;
        local_20b8[3] = 0;
        std::thread::_M_start_thread(local_20f8,&local_20b8,0);
        if (local_20b8 != (long *)0x0) {
          (**(code **)(*local_20b8 + 8))();
        }
        lVar11 = local_2108.tv_nsec;
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010eaf6;
        p_Var4[3]._vptr__Sp_counted_base = local_20f8[0];
        bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2108.tv_sec = (__time_t)p_Var6;
        local_2108.tv_nsec = (long)p_Var4;
        if (bVar17) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_sec ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          p_Var6->_M_use_count = 1;
          p_Var6->_M_weak_count = 1;
          p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157448;
          p_Var6[2]._M_use_count = 0;
          p_Var6[1]._M_use_count = 0;
          p_Var6[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var6[1]._M_weak_count + 1) = 0;
          p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157498;
          p_Var5 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)p_Var5 = 0;
          *(undefined8 *)(p_Var5 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(p_Var5);
          lVar11 = local_2108.tv_nsec;
          *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
          p_Var6[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          *(Forth ***)&p_Var6[3]._M_use_count = local_1830;
          p_Var6[4]._vptr__Sp_counted_base = (_func_int **)local_2078;
          bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2108.tv_sec = (__time_t)(p_Var6 + 1);
          local_2108.tv_nsec = (long)p_Var6;
          if (bVar17) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar11);
          }
        }
        std::__basic_future<void>::__basic_future(&local_20e8,(__state_type *)&local_2108);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20a8,
                   (future<void> *)&local_20e8);
        if (local_20e8._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_20e8._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_2108.tv_sec = 0;
        local_2108.tv_nsec = 0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001574e0;
        p_Var6 = p_Var4 + 1;
        p_Var4[2]._M_use_count = 0;
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157530;
        p_Var5 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)p_Var5 = 0;
        *(undefined8 *)(p_Var5 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(p_Var5);
        *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
        *(Forth ***)&p_Var4[4]._M_use_count = local_2030;
        p_Var4[5]._vptr__Sp_counted_base = (_func_int **)command4;
        local_20f8[0] = (_func_int **)0x0;
        local_20b0 = (long *)operator_new(0x20);
        lVar11 = local_20d0;
        *local_20b0 = (long)&PTR___State_00157588;
        local_20b0[1] = (long)p_Var6;
        local_20b0[2] =
             (long)std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:268:15)>_>,_void>
                   ::_M_run;
        local_20b0[3] = 0;
        std::thread::_M_start_thread(local_20f8,&local_20b0,0);
        if (local_20b0 != (long *)0x0) {
          (**(code **)(*local_20b0 + 8))();
        }
        lVar1 = local_2108.tv_nsec;
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) goto LAB_0010eaf6;
        p_Var4[3]._vptr__Sp_counted_base = local_20f8[0];
        bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2108.tv_sec = (__time_t)p_Var6;
        local_2108.tv_nsec = (long)p_Var4;
        if (bVar17) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_sec ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          p_Var6->_M_use_count = 1;
          p_Var6->_M_weak_count = 1;
          p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001575c8;
          p_Var6[2]._M_use_count = 0;
          p_Var6[1]._M_use_count = 0;
          p_Var6[1]._M_weak_count = 0;
          *(undefined8 *)((long)&p_Var6[1]._M_weak_count + 1) = 0;
          p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00157618;
          p_Var5 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)p_Var5 = 0;
          *(undefined8 *)(p_Var5 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(p_Var5);
          lVar11 = local_20d0;
          lVar1 = local_2108.tv_nsec;
          *(undefined ***)p_Var5 = &PTR__M_destroy_00157cd8;
          p_Var6[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
          *(Forth ***)&p_Var6[3]._M_use_count = local_2030;
          p_Var6[4]._vptr__Sp_counted_base = (_func_int **)command4;
          bVar17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2108.tv_sec = (__time_t)(p_Var6 + 1);
          local_2108.tv_nsec = (long)p_Var6;
          if (bVar17) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar1);
          }
        }
        std::__basic_future<void>::__basic_future(&local_20e8,(__state_type *)&local_2108);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108.tv_nsec);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_20a8,
                   (future<void> *)&local_20e8);
        if (local_20e8._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_20e8._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (outputToStdout) {
          printf("\nMatch %6d: ");
        }
        prVar13 = robots;
        uVar9 = 0;
        do {
          init_robot((int)uVar9);
          prVar13->status = 1;
          uVar9 = uVar9 + 1;
          prVar13 = prVar13 + 1;
        } while (uVar12 != uVar9);
        rand_pos(n);
        if (lVar11 < 1) {
          local_2110 = 0;
        }
        else {
          iVar8 = 0xf;
          local_2110 = 0;
          do {
            iVar16 = 0;
            prVar13 = robots;
            uVar9 = uVar12;
            do {
              if (prVar13->status == 1) {
                iVar16 = iVar16 + 1;
                cur_robot = prVar13;
              }
              prVar13 = prVar13 + 1;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            cycle(n);
            if ((outputToFullScreen) && (update_disp(), outputToFullScreen)) {
              local_2108.tv_sec = 0;
              local_2108.tv_nsec = 1000000;
              do {
                iVar2 = nanosleep(&local_2108,&local_2108);
                if (iVar2 != -1) break;
                piVar7 = __errno_location();
              } while (*piVar7 == 4);
            }
            iVar8 = iVar8 + -1;
            if (iVar8 == 0) {
              move_robots(0);
              move_miss(0);
              local_2110 = local_2110 + 0xf;
              pamVar14 = missiles;
              uVar9 = 0;
              do {
                lVar11 = 0;
                pmVar10 = *pamVar14;
                do {
                  if (((missile *)&pmVar10->stat)->stat == 2) {
                    count_miss((int)uVar9,(int)lVar11);
                  }
                  lVar11 = lVar11 + 1;
                  pmVar10 = pmVar10 + 1;
                } while (lVar11 == 1);
                uVar9 = uVar9 + 1;
                pamVar14 = (missile (*) [2])((long)pamVar14 + 0x58);
              } while (uVar9 != uVar12);
              iVar8 = 0xf;
              lVar11 = local_20d0;
              n = local_207c;
            }
          } while ((1 < iVar16) && (local_2110 < lVar11));
        }
        while( true ) {
          uVar9 = 0;
          pamVar14 = missiles;
          bVar17 = false;
          do {
            lVar11 = 0;
            do {
              if (*(int *)((long)&(*pamVar14)[0].stat + lVar11) == 1) {
                bVar17 = true;
              }
              lVar11 = lVar11 + 0x2c;
            } while (lVar11 == 0x2c);
            uVar9 = uVar9 + 1;
            pamVar14 = pamVar14 + 1;
          } while (uVar9 != uVar12);
          if (!bVar17) break;
          move_robots(0);
          move_miss(0);
        }
        if (outputToStdout) {
          printf(" cycles = %ld:\n  Survivors:\n",local_2110);
        }
        lVar11 = 0;
        uVar9 = 1;
        iVar8 = 0;
        do {
          if (*(int *)(robots[0].name + lVar11 + -4) == 1) {
            if (outputToStdout) {
              printf("   (%d)%14s: damage=%% %d  ",uVar9);
              putchar((lVar11 == 0xb8) + 9);
            }
            iVar8 = iVar8 + 1;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          lVar11 = lVar11 + 0xb8;
        } while (local_2060 != lVar11);
        if (iVar8 == 0) {
          if (outputToStdout) {
            puts("mutual destruction");
            goto LAB_0010e62e;
          }
        }
        else if (outputToStdout) {
          putchar(10);
LAB_0010e62e:
          if (outputToStdout) {
            puts("  Cumulative score:");
          }
        }
        puVar15 = local_2058;
        if (iVar8 == 1) {
          puVar15 = local_2048;
        }
        lVar11 = 0x159184;
        uVar9 = 0;
        do {
          if (*(int *)(lVar11 + -4) == 1) {
            puVar15[uVar9] = puVar15[uVar9] + 1;
          }
          if (outputToStdout) {
            printf("   (%d)%14s: wins=%d ties=%d  ",(ulong)((int)uVar9 + 1),lVar11,
                   (ulong)local_2048[uVar9],(ulong)local_2058[uVar9]);
            putchar((uVar9 == 1) + 9);
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0xb8;
        } while (uVar12 != uVar9);
        if (outputToStdout) {
          putchar(10);
        }
        LOCK();
        stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
        UNLOCK();
        iVar8 = 0;
        do {
          bVar17 = true;
          lVar11 = 0;
          do {
            if (*(int *)((long)robotStatus + lVar11) != 0) {
              bVar17 = false;
            }
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0x10);
          this = local_20a8.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
          if (bVar17) break;
          cycle(num_robots);
          sched_yield();
          iVar8 = iVar8 + 1;
          this = local_20a8.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        } while (iVar8 != 10000);
        for (; this != local_20a8.
                       super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
          std::future<void>::get(this);
        }
        LOCK();
        stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
        UNLOCK();
        std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_20a8);
        cppforth::Forth::~Forth((Forth *)local_2030);
        cppforth::Forth::~Forth((Forth *)local_1830);
        cppforth::Forth::~Forth((Forth *)local_1030);
        cppforth::Forth::~Forth(&local_830);
        iVar8 = (int)local_2088;
        local_2088 = (ulong)(iVar8 + 1);
      } while (iVar8 != local_20d4);
    }
    if (outputToStdout) {
      match();
    }
  }
  return;
}

Assistant:

void match(int matches,
long limit,
int num_robots,
const std::string &command1,
const std::string &command2,
const std::string &command3,
const std::string &command4,
bool outputToStdout=false,
bool outputToFullScreen=false
)
{
	//int num_robots = 0;
	stopAll.store(0);
	int robotsleft{};
	int m_count{};
	int movement{};
	int i{}, j{}, k{};
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}
	//num_robots=2;
	if (num_robots < 2) {
		if (outputToStdout) fprintf(stderr, "\n\nCannot play without at least 2 robots.\n\n");
		return;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);
		cppforth::Forth forth3{};
		InitForthRobot(forth3);
		InsertForthToInt(&forth3, 2);
		cppforth::Forth forth4{};
		InitForthRobot(forth4);
		InsertForthToInt(&forth4, 3);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth3, &command3]{
			try{
				robotStatus[2] = StatusRun;
				forth3.ExecuteString(command3);
				robotStatus[2] = StatusException;
			}
			catch (...){
				robotStatus[2] = StatusException;
			}
		}));
		allServersThreads.push_back(
			std::async([&forth4, &command4]{
			try{
				robotStatus[3] = StatusRun;
				forth4.ExecuteString(command4);
				robotStatus[3] = StatusException;
			}
			catch (...){
				robotStatus[3] = StatusException;
			}
		}));
		if (outputToStdout) printf("\nMatch %6d: ", m_count);
for (i = 0; i < num_robots; i++) {
	init_robot(i);
	// robot_go should be here
	robots[i].status = ACTIVE;
}
rand_pos(num_robots);
movement = MOTION_CYCLES;
robotsleft = num_robots;
counter = 0L;
while (robotsleft > 1 && counter < limit) {
	robotsleft = 0;
	for (i = 0; i < num_robots; i++) {
		if (robots[i].status == ACTIVE) {
			robotsleft++;
			cur_robot = &robots[i];
		}
	}
	cycle(num_robots);
	if (outputToFullScreen) update_disp();
	if (outputToFullScreen) std::this_thread::sleep_for(std::chrono::milliseconds(1));

	if (--movement == 0) {
		counter += MOTION_CYCLES;
		movement = MOTION_CYCLES;
		move_robots(0);
		move_miss(0);
#ifdef DOS
		kbhit();  /* check keyboard so ctrl-break can work */
#endif
		for (i = 0; i < num_robots; i++) {
			for (j = 0; j < MIS_ROBOT; j++) {
				if (missiles[i][j].stat == EXPLODING) {
					count_miss(i, j);
				}
			}
		}
	}
}

/* allow any flying missiles to explode */
while (1) {
	k = 0;
	for (i = 0; i < num_robots; i++) {
		for (j = 0; j < MIS_ROBOT; j++) {
			if (missiles[i][j].stat == FLYING) {
				k = 1;
			}
		}
	}
	if (k) {
		move_robots(0);
		move_miss(0);
	}
	else
		break;
}

if (outputToStdout) printf(" cycles = %ld:\n  Survivors:\n", counter);

k = 0;
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (outputToStdout) 
			printf("   (%d)%14s: damage=%% %d  ", i + 1, robots[i].name,
			robots[i].damage);
    if (i == 1) {
      if (outputToStdout) printf("\n");
    }
    else {
      if (outputToStdout) printf("\t");
    }
		k++;
	}
}

if (k == 0) {
	if (outputToStdout) printf("mutual destruction\n");
}
else {
	if (outputToStdout) printf("\n");
}

if (outputToStdout) printf("  Cumulative score:\n");
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (k == 1)
			wins[i]++;
		else
			ties[i]++;
	}
	if (outputToStdout) printf("   (%d)%14s: wins=%d ties=%d  ", i + 1, robots[i].name,
		wins[i], ties[i]);
  if (i == 1) {
    if (outputToStdout) printf("\n");
  }
  else {
    if (outputToStdout) printf("\t");
  }
}
if (outputToStdout) printf("\n");
stopAll.store(1);
for (int i = 0; i < 10000; ++i){
	auto end = true;
	for (j = 0; j < 4; ++j){
		if (robotStatus[j] != StatusException){
			end = false;
		}
	}
	if (end) 
		break;
	cycle(num_robots);
	std::this_thread::yield();
}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	if (outputToStdout) fprintf(stderr, "\nMatch play finished.\n\n");
	return ;

}